

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

void __thiscall
Js::JavascriptStackWalker::WalkAndClearInlineeFrameCallInfoOnException
          (JavascriptStackWalker *this,void *tryHandlerAddrOfReturnAddr)

{
  BOOL BVar1;
  uint uVar2;
  InlinedFrame *pIVar3;
  int index;
  bool bVar4;
  
  do {
    BVar1 = Walk(this,true);
    if (BVar1 == 0) {
      return;
    }
    BVar1 = JavascriptFunction::IsNativeAddress(this->scriptContext,(this->currentFrame).codeAddr);
    if (BVar1 != 0) {
      if ((this->lastInternalFrameInfo).codeAddress == (void *)0x0) {
        uVar2 = (uint)((byte)this->field_0x50 >> 1);
      }
      else {
        uVar2._0_1_ = (this->lastInternalFrameInfo).hasInlinedFramesOnStack;
        uVar2._1_1_ = (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout;
        uVar2._2_2_ = *(undefined2 *)&(this->lastInternalFrameInfo).field_0x2a;
      }
      if (((uVar2 & 1) != 0) && (index = (this->inlinedFrameWalker).frameCount + -1, -1 < index)) {
        do {
          pIVar3 = InlinedFrameWalker::GetFrameAtIndex(&this->inlinedFrameWalker,index);
          *(byte *)&(pIVar3->super_InlinedFrameLayout).callInfo =
               *(byte *)&(pIVar3->super_InlinedFrameLayout).callInfo & 0xf0;
          (pIVar3->super_InlinedFrameLayout).callInfo.InlineeStartOffset = 0;
          bVar4 = index != 0;
          index = index + -1;
        } while (bVar4);
      }
    }
  } while ((this->currentFrame).frame + 1 != (void **)tryHandlerAddrOfReturnAddr);
  return;
}

Assistant:

void JavascriptStackWalker::WalkAndClearInlineeFrameCallInfoOnException(void *tryHandlerAddrOfReturnAddr)
    {
        // Walk the stack and when we find the first native frame, we clear the inlinee's callinfo for this frame
        // It is sufficient we stop at the first native frame which had the enclosing try-catch
        // TODO : Revisit when we start inlining functions with try-catch/try-finally
        while (this->Walk(true))
        {
            if (JavascriptFunction::IsNativeAddress(this->scriptContext, this->currentFrame.GetInstructionPointer()))
            {
                if (HasInlinedFramesOnStack())
                {
                    for (int index = inlinedFrameWalker.GetFrameCount() - 1; index >= 0; index--)
                    {
                        auto inlinedFrame = inlinedFrameWalker.GetFrameAtIndex(index);
                        inlinedFrame->callInfo.Clear();
                    }
                }
            }
            if (this->currentFrame.GetAddressOfReturnAddress() == tryHandlerAddrOfReturnAddr)
            {
                break;
            }
        }
    }